

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

int __thiscall CPU::instrLDX0xbe(CPU *this)

{
  uint8_t argument;
  
  argument = absolute_y_addr(this);
  LDX(this,argument);
  return 4;
}

Assistant:

int CPU::instrLDX0xbe() {
	LDX(absolute_y_addr());
	return 4;
}